

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::IsMessageTypeVisible(cmake *this,MessageType t)

{
  bool bVar1;
  
  bVar1 = true;
  switch(t) {
  case AUTHOR_WARNING:
    bVar1 = GetSuppressDevWarnings(this,(cmMakefile *)0x0);
    break;
  case AUTHOR_ERROR:
    bVar1 = GetDevWarningsAsErrors(this,(cmMakefile *)0x0);
    return bVar1;
  default:
    goto switchD_00322fa6_caseD_2;
  case DEPRECATION_ERROR:
    bVar1 = GetDeprecatedWarningsAsErrors(this,(cmMakefile *)0x0);
    return bVar1;
  case DEPRECATION_WARNING:
    bVar1 = GetSuppressDeprecatedWarnings(this,(cmMakefile *)0x0);
  }
  bVar1 = (bool)(bVar1 ^ 1);
switchD_00322fa6_caseD_2:
  return bVar1;
}

Assistant:

bool cmake::IsMessageTypeVisible(cmake::MessageType t)
{
  bool isVisible = true;

  if(t == cmake::DEPRECATION_ERROR)
    {
    if(!this->GetDeprecatedWarningsAsErrors())
      {
      isVisible = false;
      }
    }
  else if (t == cmake::DEPRECATION_WARNING)
    {
    if (this->GetSuppressDeprecatedWarnings())
      {
      isVisible = false;
      }
    }
  else if (t == cmake::AUTHOR_ERROR)
    {
    if (!this->GetDevWarningsAsErrors())
      {
      isVisible = false;
      }
    }
  else if (t == cmake::AUTHOR_WARNING)
    {
    if (this->GetSuppressDevWarnings())
      {
      isVisible = false;
      }
    }

  return isVisible;
}